

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  byte bVar1;
  U32 UVar2;
  uint uVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  U32 *pUVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  uint *puVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  U32 *chainTable_1;
  ulong uVar19;
  U32 *chainTable;
  uint uVar20;
  uint uVar21;
  U32 UVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  
  uVar11 = (ms->cParams).minMatch;
  if (uVar11 - 6 < 2) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar20 = 1 << (bVar1 & 0x1f);
    pUVar4 = ms->chainTable;
    pBVar5 = (ms->window).base;
    uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar24 = (uint)((long)ip - (long)pBVar5);
    UVar22 = uVar24 - uVar11;
    if (uVar24 - UVar2 <= uVar11) {
      UVar22 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar22 = UVar2;
    }
    pZVar6 = ms->dictMatchState;
    lVar18 = *(long *)ip;
    uVar23 = (ulong)(lVar18 * -0x30e4432340650000) >>
             (0x42U - (char)(pZVar6->cParams).hashLog & 0x3f);
    uVar11 = (ms->window).dictLimit;
    uVar21 = (ms->cParams).searchLog;
    pUVar7 = pZVar6->hashTable;
    bVar15 = 0x40 - (char)(ms->cParams).hashLog;
    pUVar8 = ms->hashTable;
    for (uVar27 = (ulong)ms->nextToUpdate; uVar27 < ((long)ip - (long)pBVar5 & 0xffffffffU);
        uVar27 = uVar27 + 1) {
      uVar25 = (ulong)(*(long *)(pBVar5 + uVar27) * -0x30e4432340650000) >> (bVar15 & 0x3f);
      pUVar4[(uint)uVar27 & ~(-1 << (bVar1 & 0x1f))] = pUVar8[uVar25];
      pUVar8[uVar25] = (uint)uVar27;
    }
    uVar26 = uVar24 - uVar20;
    if (uVar24 < uVar20) {
      uVar26 = 0;
    }
    ms->nextToUpdate = uVar24;
    puVar14 = pUVar8 + ((ulong)(lVar18 * -0x30e4432340650000) >> (bVar15 & 0x3f));
    uVar27 = 3;
    uVar21 = 1 << ((byte)uVar21 & 0x1f);
    while (uVar21 != 0) {
      uVar3 = *puVar14;
      if (((uVar3 < UVar22) ||
          ((((pBVar5 + uVar3)[uVar27] == ip[uVar27] &&
            (sVar12 = ZSTD_count(ip,pBVar5 + uVar3,iLimit), uVar27 < sVar12)) &&
           (*offsetPtr = (ulong)((uVar24 + 2) - uVar3), uVar27 = sVar12, ip + sVar12 == iLimit))))
         || (uVar3 <= uVar26)) break;
      puVar14 = pUVar4 + (uVar3 & uVar20 - 1);
      uVar21 = uVar21 - 1;
    }
    pBVar9 = (pZVar6->window).nextSrc;
    pBVar10 = (pZVar6->window).base;
    for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    }
    uVar25 = 3;
    if (uVar21 < 3) {
      uVar25 = (ulong)uVar21;
    }
    uVar20 = pUVar7[uVar23 * 4 + 3];
    pUVar4 = pZVar6->chainTable;
    iVar16 = uVar24 + 2 + (((int)pBVar9 - (int)pBVar10) - uVar11);
    for (uVar19 = 0; uVar19 < uVar25; uVar19 = uVar19 + 1) {
      uVar24 = pUVar7[uVar23 * 4 + uVar19];
      if ((ulong)uVar24 == 0) {
        return uVar27;
      }
      if (*(int *)(pBVar10 + uVar24) == *(int *)ip) {
        sVar12 = ZSTD_count_2segments
                           (ip + 4,(BYTE *)((long)(pBVar10 + uVar24) + 4),iLimit,pBVar9,
                            pBVar5 + uVar11);
        uVar13 = sVar12 + 4;
        if ((uVar27 < uVar13) &&
           (*offsetPtr = (ulong)(iVar16 - uVar24), uVar27 = uVar13, ip + uVar13 == iLimit)) {
          return uVar13;
        }
      }
      uVar21 = uVar21 - 1;
    }
    uVar24 = uVar20 & 0xff;
    if (uVar21 < (uVar20 & 0xff)) {
      uVar24 = uVar21;
    }
    for (uVar23 = 0; uVar23 < uVar24; uVar23 = uVar23 + 1) {
    }
    uVar24 = uVar20 & 0xff;
    if (uVar21 < (uVar20 & 0xff)) {
      uVar24 = uVar21;
    }
    for (lVar18 = 0; uVar24 != (uint)lVar18; lVar18 = lVar18 + 1) {
      uVar21 = pUVar4[(ulong)(uVar20 >> 8) + lVar18];
      if (*(int *)(pBVar10 + uVar21) == *(int *)ip) {
        sVar12 = ZSTD_count_2segments
                           (ip + 4,pBVar10 + (ulong)uVar21 + 4,iLimit,pBVar9,pBVar5 + uVar11);
        uVar23 = sVar12 + 4;
        if ((uVar27 < uVar23) &&
           (*offsetPtr = (ulong)(iVar16 - uVar21), uVar27 = uVar23, ip + uVar23 == iLimit)) {
          return uVar23;
        }
      }
    }
  }
  else if (uVar11 == 5) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar20 = 1 << (bVar1 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar24 = (uint)((long)ip - (long)pBVar5);
    UVar22 = uVar24 - uVar11;
    if (uVar24 - UVar2 <= uVar11) {
      UVar22 = UVar2;
    }
    pUVar4 = ms->chainTable;
    uVar11 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      UVar22 = UVar2;
    }
    uVar21 = (ms->cParams).searchLog;
    pZVar6 = ms->dictMatchState;
    lVar18 = *(long *)ip;
    uVar23 = (ulong)(lVar18 * -0x30e4432345000000) >>
             (0x42U - (char)(pZVar6->cParams).hashLog & 0x3f);
    pUVar7 = pZVar6->hashTable;
    bVar15 = 0x40 - (char)(ms->cParams).hashLog;
    pUVar8 = ms->hashTable;
    for (uVar27 = (ulong)ms->nextToUpdate; uVar27 < ((long)ip - (long)pBVar5 & 0xffffffffU);
        uVar27 = uVar27 + 1) {
      uVar25 = (ulong)(*(long *)(pBVar5 + uVar27) * -0x30e4432345000000) >> (bVar15 & 0x3f);
      pUVar4[(uint)uVar27 & ~(-1 << (bVar1 & 0x1f))] = pUVar8[uVar25];
      pUVar8[uVar25] = (uint)uVar27;
    }
    uVar26 = uVar24 - uVar20;
    if (uVar24 < uVar20) {
      uVar26 = 0;
    }
    ms->nextToUpdate = uVar24;
    puVar14 = pUVar8 + ((ulong)(lVar18 * -0x30e4432345000000) >> (bVar15 & 0x3f));
    uVar27 = 3;
    uVar21 = 1 << ((byte)uVar21 & 0x1f);
    while (uVar21 != 0) {
      uVar3 = *puVar14;
      if (((uVar3 < UVar22) ||
          ((((pBVar5 + uVar3)[uVar27] == ip[uVar27] &&
            (sVar12 = ZSTD_count(ip,pBVar5 + uVar3,iLimit), uVar27 < sVar12)) &&
           (*offsetPtr = (ulong)((uVar24 + 2) - uVar3), uVar27 = sVar12, ip + sVar12 == iLimit))))
         || (uVar3 <= uVar26)) break;
      puVar14 = pUVar4 + (uVar3 & uVar20 - 1);
      uVar21 = uVar21 - 1;
    }
    pBVar9 = (pZVar6->window).nextSrc;
    pBVar10 = (pZVar6->window).base;
    for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    }
    uVar25 = 3;
    if (uVar21 < 3) {
      uVar25 = (ulong)uVar21;
    }
    uVar20 = pUVar7[uVar23 * 4 + 3];
    pUVar4 = pZVar6->chainTable;
    iVar16 = uVar24 + 2 + (((int)pBVar9 - (int)pBVar10) - uVar11);
    for (uVar19 = 0; uVar19 < uVar25; uVar19 = uVar19 + 1) {
      uVar24 = pUVar7[uVar23 * 4 + uVar19];
      if ((ulong)uVar24 == 0) {
        return uVar27;
      }
      if (*(int *)(pBVar10 + uVar24) == *(int *)ip) {
        sVar12 = ZSTD_count_2segments
                           (ip + 4,(BYTE *)((long)(pBVar10 + uVar24) + 4),iLimit,pBVar9,
                            pBVar5 + uVar11);
        uVar13 = sVar12 + 4;
        if ((uVar27 < uVar13) &&
           (*offsetPtr = (ulong)(iVar16 - uVar24), uVar27 = uVar13, ip + uVar13 == iLimit)) {
          return uVar13;
        }
      }
      uVar21 = uVar21 - 1;
    }
    uVar24 = uVar20 & 0xff;
    if (uVar21 < (uVar20 & 0xff)) {
      uVar24 = uVar21;
    }
    for (uVar23 = 0; uVar23 < uVar24; uVar23 = uVar23 + 1) {
    }
    uVar24 = uVar20 & 0xff;
    if (uVar21 < (uVar20 & 0xff)) {
      uVar24 = uVar21;
    }
    for (lVar18 = 0; uVar24 != (uint)lVar18; lVar18 = lVar18 + 1) {
      uVar21 = pUVar4[(ulong)(uVar20 >> 8) + lVar18];
      if (*(int *)(pBVar10 + uVar21) == *(int *)ip) {
        sVar12 = ZSTD_count_2segments
                           (ip + 4,pBVar10 + (ulong)uVar21 + 4,iLimit,pBVar9,pBVar5 + uVar11);
        uVar23 = sVar12 + 4;
        if ((uVar27 < uVar23) &&
           (*offsetPtr = (ulong)(iVar16 - uVar21), uVar27 = uVar23, ip + uVar23 == iLimit)) {
          return uVar23;
        }
      }
    }
  }
  else {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar21 = 1 << (bVar1 & 0x1f);
    pUVar4 = ms->chainTable;
    pBVar5 = (ms->window).base;
    uVar11 = (ms->window).dictLimit;
    uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar24 = (uint)((long)ip - (long)pBVar5);
    UVar22 = uVar24 - uVar20;
    if (uVar24 - UVar2 <= uVar20) {
      UVar22 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar22 = UVar2;
    }
    uVar20 = (ms->cParams).searchLog;
    pZVar6 = ms->dictMatchState;
    uVar23 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >>
                    (0x22U - (char)(pZVar6->cParams).hashLog & 0x1f));
    pUVar7 = pZVar6->hashTable;
    pUVar8 = ms->hashTable;
    bVar15 = 0x20 - (char)(ms->cParams).hashLog;
    for (uVar27 = (ulong)ms->nextToUpdate; uVar27 < ((long)ip - (long)pBVar5 & 0xffffffffU);
        uVar27 = uVar27 + 1) {
      uVar26 = (uint)(*(int *)(pBVar5 + uVar27) * -0x61c8864f) >> (bVar15 & 0x1f);
      pUVar4[(uint)uVar27 & ~(-1 << (bVar1 & 0x1f))] = pUVar8[uVar26];
      pUVar8[uVar26] = (uint)uVar27;
    }
    uVar26 = uVar24 - uVar21;
    if (uVar24 < uVar21) {
      uVar26 = 0;
    }
    ms->nextToUpdate = uVar24;
    iVar16 = *(int *)ip;
    puVar14 = pUVar8 + ((uint)(iVar16 * -0x61c8864f) >> (bVar15 & 0x1f));
    uVar27 = 3;
    uVar20 = 1 << ((byte)uVar20 & 0x1f);
    while (uVar20 != 0) {
      uVar3 = *puVar14;
      if ((uVar3 < UVar22) ||
         (((((pBVar5 + uVar3)[uVar27] == ip[uVar27] &&
            (sVar12 = ZSTD_count(ip,pBVar5 + uVar3,iLimit), uVar27 < sVar12)) &&
           (*offsetPtr = (ulong)((uVar24 + 2) - uVar3), uVar27 = sVar12, ip + sVar12 == iLimit)) ||
          (uVar3 <= uVar26)))) break;
      puVar14 = pUVar4 + (uVar3 & uVar21 - 1);
      uVar20 = uVar20 - 1;
    }
    pBVar9 = (pZVar6->window).nextSrc;
    pBVar10 = (pZVar6->window).base;
    for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    }
    uVar25 = 3;
    if (uVar20 < 3) {
      uVar25 = (ulong)uVar20;
    }
    uVar21 = pUVar7[uVar23 * 4 + 3];
    pUVar4 = pZVar6->chainTable;
    iVar17 = uVar24 + 2 + (((int)pBVar9 - (int)pBVar10) - uVar11);
    for (uVar19 = 0; uVar19 < uVar25; uVar19 = uVar19 + 1) {
      uVar24 = pUVar7[uVar23 * 4 + uVar19];
      if ((ulong)uVar24 == 0) {
        return uVar27;
      }
      if (*(int *)(pBVar10 + uVar24) == iVar16) {
        sVar12 = ZSTD_count_2segments
                           (ip + 4,(BYTE *)((long)(pBVar10 + uVar24) + 4),iLimit,pBVar9,
                            pBVar5 + uVar11);
        uVar13 = sVar12 + 4;
        if ((uVar27 < uVar13) &&
           (*offsetPtr = (ulong)(iVar17 - uVar24), uVar27 = uVar13, ip + uVar13 == iLimit)) {
          return uVar13;
        }
      }
      uVar20 = uVar20 - 1;
    }
    uVar24 = uVar21 & 0xff;
    if (uVar20 < (uVar21 & 0xff)) {
      uVar24 = uVar20;
    }
    for (uVar23 = 0; uVar23 < uVar24; uVar23 = uVar23 + 1) {
    }
    uVar24 = uVar21 & 0xff;
    if (uVar20 < (uVar21 & 0xff)) {
      uVar24 = uVar20;
    }
    for (lVar18 = 0; uVar24 != (uint)lVar18; lVar18 = lVar18 + 1) {
      uVar20 = pUVar4[(ulong)(uVar21 >> 8) + lVar18];
      if (*(int *)(pBVar10 + uVar20) == iVar16) {
        sVar12 = ZSTD_count_2segments
                           (ip + 4,pBVar10 + (ulong)uVar20 + 4,iLimit,pBVar9,pBVar5 + uVar11);
        uVar23 = sVar12 + 4;
        if ((uVar27 < uVar23) &&
           (*offsetPtr = (ulong)(iVar17 - uVar20), uVar27 = uVar23, ip + uVar23 == iLimit)) {
          return uVar23;
        }
      }
    }
  }
  return uVar27;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dedicatedDictSearch);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dedicatedDictSearch);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dedicatedDictSearch);
    }
}